

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O0

int target_data_end(DeviceTy *Device,int32_t arg_num,void **args_base,void **args,int64_t *arg_sizes
                   ,int64_t *arg_types)

{
  ulong uVar1;
  DeviceTy *pDVar2;
  bool bVar3;
  int32_t iVar4;
  int iVar5;
  pointer ppVar6;
  long in_RCX;
  long lVar7;
  int in_ESI;
  long in_R8;
  long in_R9;
  bool bVar8;
  int rt_1;
  void **ShadowHstPtrAddr;
  iterator it;
  uintptr_t ub;
  uintptr_t lb;
  int rt;
  long parent_rc;
  int32_t parent_idx;
  bool CopyMember;
  bool Always;
  bool DelEntry;
  void *TgtPtrBegin;
  bool ForceDelete;
  bool UpdateRef;
  bool IsLast;
  int next_i;
  int64_t padding;
  int64_t data_size;
  void *HstPtrBegin;
  int32_t i;
  map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
  *in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff40;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined4 in_stack_ffffffffffffff44;
  _Base_ptr in_stack_ffffffffffffff48;
  iterator in_stack_ffffffffffffff50;
  iterator in_stack_ffffffffffffff60;
  iterator in_stack_ffffffffffffff68;
  DeviceTy *in_stack_ffffffffffffff70;
  DeviceTy *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  byte local_5d;
  long local_50;
  DeviceTy *local_48;
  int local_3c;
  
  local_3c = in_ESI + -1;
  do {
    if (local_3c < 0) {
      return 0;
    }
    if (((*(ulong *)(in_R9 + (long)local_3c * 8) & 0x100) == 0) &&
       ((*(ulong *)(in_R9 + (long)local_3c * 8) & 0x80) == 0)) {
      local_48 = *(DeviceTy **)(in_RCX + (long)local_3c * 8);
      local_50 = *(long *)(in_R8 + (long)local_3c * 8);
      iVar4 = member_of(*(int64_t *)(in_R9 + (long)local_3c * 8));
      if ((iVar4 < 0) &&
         (((local_3c + 1 < in_ESI &&
           (iVar4 = member_of(*(int64_t *)(in_R9 + (long)(local_3c + 1) * 8)), iVar4 == local_3c))
          && (lVar7 = (long)local_48 % 8, lVar7 != 0)))) {
        local_48 = (DeviceTy *)((long)local_48 - lVar7);
        local_50 = lVar7 + local_50;
      }
      uVar10 = true;
      if ((*(ulong *)(in_R9 + (long)local_3c * 8) & 0xffff000000000000) != 0) {
        uVar10 = (*(ulong *)(in_R9 + (long)local_3c * 8) & 0x10) != 0;
      }
      uVar1 = *(ulong *)(in_R9 + (long)local_3c * 8);
      DeviceTy::getTgtPtrBegin
                ((DeviceTy *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78,(int64_t)in_stack_ffffffffffffff70,
                 (bool *)in_stack_ffffffffffffff68._M_node,
                 SUB81((ulong)in_stack_ffffffffffffff60._M_node >> 0x38,0));
      uVar9 = (local_5d & 1) != 0 || (uVar1 & 8) != 0;
      bVar3 = (bool)uVar9;
      if (((*(ulong *)(in_R9 + (long)local_3c * 8) & 0xffff000000000000) != 0) &&
         ((*(ulong *)(in_R9 + (long)local_3c * 8) & 0x10) == 0)) {
        bVar3 = false;
      }
      if (((*(ulong *)(in_R9 + (long)local_3c * 8) & 2) != 0) || (bVar3)) {
        if ((*(ulong *)(in_R9 + (long)local_3c * 8) & 2) != 0) {
          uVar1 = *(ulong *)(in_R9 + (long)local_3c * 8);
          bVar8 = false;
          if (((*(ulong *)(in_R9 + (long)local_3c * 8) & 0xffff000000000000) != 0) &&
             ((*(ulong *)(in_R9 + (long)local_3c * 8) & 0x10) == 0)) {
            member_of(*(int64_t *)(in_R9 + (long)local_3c * 8));
            lVar7 = DeviceTy::getMapEntryRefCnt
                              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68._M_node);
            bVar8 = lVar7 == 1;
          }
          if (((bVar3) || ((uVar1 & 4) != 0)) || (bVar8)) {
            iVar4 = DeviceTy::data_retrieve
                              ((DeviceTy *)in_stack_ffffffffffffff50._M_node,
                               in_stack_ffffffffffffff48,
                               (void *)CONCAT44(in_stack_ffffffffffffff44,
                                                CONCAT13(uVar10,CONCAT12(uVar9,
                                                  in_stack_ffffffffffffff40))),
                               (int64_t)in_stack_ffffffffffffff38);
            if (iVar4 != 0) {
              return -1;
            }
            in_stack_ffffffffffffff84 = 0;
          }
        }
        in_stack_ffffffffffffff70 = (DeviceTy *)((long)&local_48->DeviceID + local_50);
        std::mutex::lock((mutex *)CONCAT44(in_stack_ffffffffffffff44,
                                           CONCAT13(uVar10,CONCAT12(uVar9,in_stack_ffffffffffffff40)
                                                   )));
        in_stack_ffffffffffffff68 =
             std::
             map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
             ::begin(in_stack_ffffffffffffff38);
        while( true ) {
          in_stack_ffffffffffffff60 =
               std::
               map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
               ::end(in_stack_ffffffffffffff38);
          bVar8 = std::operator!=((_Self *)&stack0xffffffffffffff68,
                                  (_Self *)&stack0xffffffffffffff60);
          if (!bVar8) break;
          ppVar6 = std::_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_>::operator->
                             ((_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_> *)0x114a44
                             );
          pDVar2 = (DeviceTy *)ppVar6->first;
          if (pDVar2 < local_48) {
            std::_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_>::operator++
                      ((_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_> *)
                       CONCAT44(in_stack_ffffffffffffff44,
                                CONCAT13(uVar10,CONCAT12(uVar9,in_stack_ffffffffffffff40))));
          }
          else {
            if (in_stack_ffffffffffffff70 <= pDVar2) break;
            if ((*(ulong *)(in_R9 + (long)local_3c * 8) & 2) != 0) {
              ppVar6 = std::_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_>::operator->
                                 ((_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_> *)
                                  0x114a9a);
              *(void **)pDVar2 = (ppVar6->second).HstPtrVal;
            }
            if (bVar3) {
              in_stack_ffffffffffffff50 =
                   std::
                   map<void*,ShadowPtrValTy,std::less<void*>,std::allocator<std::pair<void*const,ShadowPtrValTy>>>
                   ::erase_abi_cxx11_((map<void_*,_ShadowPtrValTy,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
                                       *)CONCAT44(in_stack_ffffffffffffff44,
                                                  CONCAT13(uVar10,CONCAT12(uVar9,
                                                  in_stack_ffffffffffffff40))),
                                      in_stack_ffffffffffffff68);
              in_stack_ffffffffffffff48 = in_stack_ffffffffffffff68._M_node;
              in_stack_ffffffffffffff68 = in_stack_ffffffffffffff50;
            }
            else {
              std::_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_>::operator++
                        ((_Rb_tree_iterator<std::pair<void_*const,_ShadowPtrValTy>_> *)
                         CONCAT44(in_stack_ffffffffffffff44,
                                  CONCAT13(uVar10,CONCAT12(uVar9,in_stack_ffffffffffffff40))));
            }
          }
        }
        std::mutex::unlock((mutex *)0x114b01);
        in_stack_ffffffffffffff78 = local_48;
        if (bVar3) {
          iVar5 = DeviceTy::deallocTgtPtr
                            ((DeviceTy *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),local_48,
                             (int64_t)in_stack_ffffffffffffff70,
                             SUB81((ulong)in_stack_ffffffffffffff68._M_node >> 0x38,0));
          if (iVar5 != 0) {
            return -1;
          }
          in_stack_ffffffffffffff44 = 0;
          in_stack_ffffffffffffff78 = local_48;
        }
      }
    }
    local_3c = local_3c + -1;
  } while( true );
}

Assistant:

int target_data_end(DeviceTy &Device, int32_t arg_num, void **args_base,
    void **args, int64_t *arg_sizes, int64_t *arg_types) {
  // process each input.
  for (int32_t i = arg_num - 1; i >= 0; --i) {
    // Ignore private variables and arrays - there is no mapping for them.
    // Also, ignore the use_device_ptr directive, it has no effect here.
    if ((arg_types[i] & OMP_TGT_MAPTYPE_LITERAL) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PRIVATE))
      continue;

    void *HstPtrBegin = args[i];
    int64_t data_size = arg_sizes[i];
    // Adjust for proper alignment if this is a combined entry (for structs).
    // Look at the next argument - if that is MEMBER_OF this one, then this one
    // is a combined entry.
    int64_t padding = 0;
    const int next_i = i+1;
    if (member_of(arg_types[i]) < 0 && next_i < arg_num &&
        member_of(arg_types[next_i]) == i) {
      padding = (int64_t)HstPtrBegin % alignment;
      if (padding) {
        DP("Using a padding of %" PRId64 " bytes for begin address " DPxMOD
            "\n", padding, DPxPTR(HstPtrBegin));
        HstPtrBegin = (char *) HstPtrBegin - padding;
        data_size += padding;
      }
    }

    bool IsLast;
    bool UpdateRef = !(arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) ||
        (arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ);
    bool ForceDelete = arg_types[i] & OMP_TGT_MAPTYPE_DELETE;

    // If PTR_AND_OBJ, HstPtrBegin is address of pointee
    void *TgtPtrBegin = Device.getTgtPtrBegin(HstPtrBegin, data_size, IsLast,
        UpdateRef);
    DP("There are %" PRId64 " bytes allocated at target address " DPxMOD
        " - is%s last\n", data_size, DPxPTR(TgtPtrBegin),
        (IsLast ? "" : " not"));

    bool DelEntry = IsLast || ForceDelete;

    if ((arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) &&
        !(arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ)) {
      DelEntry = false; // protect parent struct from being deallocated
    }

    if ((arg_types[i] & OMP_TGT_MAPTYPE_FROM) || DelEntry) {
      // Move data back to the host
      if (arg_types[i] & OMP_TGT_MAPTYPE_FROM) {
        bool Always = arg_types[i] & OMP_TGT_MAPTYPE_ALWAYS;
        bool CopyMember = false;
        if ((arg_types[i] & OMP_TGT_MAPTYPE_MEMBER_OF) &&
            !(arg_types[i] & OMP_TGT_MAPTYPE_PTR_AND_OBJ)) {
          // Copy data only if the "parent" struct has RefCount==1.
          int32_t parent_idx = member_of(arg_types[i]);
          long parent_rc = Device.getMapEntryRefCnt(args[parent_idx]);
          assert(parent_rc > 0 && "parent struct not found");
          if (parent_rc == 1) {
            CopyMember = true;
          }
        }

        if (DelEntry || Always || CopyMember) {
          DP("Moving %" PRId64 " bytes (tgt:" DPxMOD ") -> (hst:" DPxMOD ")\n",
              data_size, DPxPTR(TgtPtrBegin), DPxPTR(HstPtrBegin));
          int rt = Device.data_retrieve(HstPtrBegin, TgtPtrBegin, data_size);
          if (rt != OFFLOAD_SUCCESS) {
            DP("Copying data from device failed.\n");
            return OFFLOAD_FAIL;
          }
        }
      }

      // If we copied back to the host a struct/array containing pointers, we
      // need to restore the original host pointer values from their shadow
      // copies. If the struct is going to be deallocated, remove any remaining
      // shadow pointer entries for this struct.
      uintptr_t lb = (uintptr_t) HstPtrBegin;
      uintptr_t ub = (uintptr_t) HstPtrBegin + data_size;
      Device.ShadowMtx.lock();
      for (ShadowPtrListTy::iterator it = Device.ShadowPtrMap.begin();
           it != Device.ShadowPtrMap.end();) {
        void **ShadowHstPtrAddr = (void**) it->first;

        // An STL map is sorted on its keys; use this property
        // to quickly determine when to break out of the loop.
        if ((uintptr_t) ShadowHstPtrAddr < lb) {
          ++it;
          continue;
        }
        if ((uintptr_t) ShadowHstPtrAddr >= ub)
          break;

        // If we copied the struct to the host, we need to restore the pointer.
        if (arg_types[i] & OMP_TGT_MAPTYPE_FROM) {
          DP("Restoring original host pointer value " DPxMOD " for host "
              "pointer " DPxMOD "\n", DPxPTR(it->second.HstPtrVal),
              DPxPTR(ShadowHstPtrAddr));
          *ShadowHstPtrAddr = it->second.HstPtrVal;
        }
        // If the struct is to be deallocated, remove the shadow entry.
        if (DelEntry) {
          DP("Removing shadow pointer " DPxMOD "\n", DPxPTR(ShadowHstPtrAddr));
          it = Device.ShadowPtrMap.erase(it);
        } else {
          ++it;
        }
      }
      Device.ShadowMtx.unlock();

      // Deallocate map
      if (DelEntry) {
        int rt = Device.deallocTgtPtr(HstPtrBegin, data_size, ForceDelete);
        if (rt != OFFLOAD_SUCCESS) {
          DP("Deallocating data from device failed.\n");
          return OFFLOAD_FAIL;
        }
      }
    }
  }

  return OFFLOAD_SUCCESS;
}